

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.c
# Opt level: O2

c_int unscale_data(OSQPWorkspace *work)

{
  c_float *pcVar1;
  
  mat_mult_scalar(work->data->P,work->scaling->cinv);
  mat_premult_diag(work->data->P,work->scaling->Dinv);
  mat_postmult_diag(work->data->P,work->scaling->Dinv);
  vec_mult_scalar(work->data->q,work->scaling->cinv,work->data->n);
  pcVar1 = work->data->q;
  vec_ew_prod(work->scaling->Dinv,pcVar1,pcVar1,work->data->n);
  mat_premult_diag(work->data->A,work->scaling->Einv);
  mat_postmult_diag(work->data->A,work->scaling->Dinv);
  pcVar1 = work->data->l;
  vec_ew_prod(work->scaling->Einv,pcVar1,pcVar1,work->data->m);
  pcVar1 = work->data->u;
  vec_ew_prod(work->scaling->Einv,pcVar1,pcVar1,work->data->m);
  return 0;
}

Assistant:

c_int unscale_data(OSQPWorkspace *work) {
  // Unscale cost
  mat_mult_scalar(work->data->P, work->scaling->cinv);
  mat_premult_diag(work->data->P, work->scaling->Dinv);
  mat_postmult_diag(work->data->P, work->scaling->Dinv);
  vec_mult_scalar(work->data->q, work->scaling->cinv, work->data->n);
  vec_ew_prod(work->scaling->Dinv, work->data->q, work->data->q, work->data->n);

  // Unscale constraints
  mat_premult_diag(work->data->A, work->scaling->Einv);
  mat_postmult_diag(work->data->A, work->scaling->Dinv);
  vec_ew_prod(work->scaling->Einv, work->data->l, work->data->l, work->data->m);
  vec_ew_prod(work->scaling->Einv, work->data->u, work->data->u, work->data->m);

  return 0;
}